

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::SymbolsWrapper::doCopyFrom(SymbolsWrapper *this,SymbolsWrapper *other)

{
  SymbolsPointerType SVar1;
  DecimalFormatSymbols *this_00;
  
  SVar1 = other->fType;
  this->fType = SVar1;
  if (SVar1 == SYMPTR_NS) {
    if ((other->fPtr).dfs != (DecimalFormatSymbols *)0x0) {
      this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0x58,(size_t)other);
      if (this_00 != (DecimalFormatSymbols *)0x0) {
        NumberingSystem::NumberingSystem((NumberingSystem *)this_00,(other->fPtr).ns);
      }
      goto LAB_002666be;
    }
  }
  else {
    if (SVar1 != SYMPTR_DFS) {
      return;
    }
    if ((other->fPtr).dfs != (DecimalFormatSymbols *)0x0) {
      this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)other);
      if (this_00 != (DecimalFormatSymbols *)0x0) {
        DecimalFormatSymbols::DecimalFormatSymbols(this_00,(other->fPtr).dfs);
      }
      goto LAB_002666be;
    }
  }
  this_00 = (DecimalFormatSymbols *)0x0;
LAB_002666be:
  (this->fPtr).dfs = this_00;
  return;
}

Assistant:

void SymbolsWrapper::doCopyFrom(const SymbolsWrapper& other) {
    fType = other.fType;
    switch (fType) {
        case SYMPTR_NONE:
            // No action necessary
            break;
        case SYMPTR_DFS:
            // Memory allocation failures are exposed in copyErrorTo()
            if (other.fPtr.dfs != nullptr) {
                fPtr.dfs = new DecimalFormatSymbols(*other.fPtr.dfs);
            } else {
                fPtr.dfs = nullptr;
            }
            break;
        case SYMPTR_NS:
            // Memory allocation failures are exposed in copyErrorTo()
            if (other.fPtr.ns != nullptr) {
                fPtr.ns = new NumberingSystem(*other.fPtr.ns);
            } else {
                fPtr.ns = nullptr;
            }
            break;
    }
}